

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O2

void __thiscall btDiscreteDynamicsWorld::~btDiscreteDynamicsWorld(btDiscreteDynamicsWorld *this)

{
  (this->super_btDynamicsWorld).super_btCollisionWorld._vptr_btCollisionWorld =
       (_func_int **)&PTR__btDiscreteDynamicsWorld_001f17c8;
  if (this->m_ownsIslandManager == true) {
    (**this->m_islandManager->_vptr_btSimulationIslandManager)();
    btAlignedFreeInternal(this->m_islandManager);
  }
  if (this->m_solverIslandCallback != (InplaceSolverIslandCallback *)0x0) {
    (**(this->m_solverIslandCallback->super_IslandCallback)._vptr_IslandCallback)();
    btAlignedFreeInternal(this->m_solverIslandCallback);
  }
  if (this->m_ownsConstraintSolver == true) {
    (**this->m_constraintSolver->_vptr_btConstraintSolver)();
    btAlignedFreeInternal(this->m_constraintSolver);
  }
  btAlignedObjectArray<btPersistentManifold_*>::~btAlignedObjectArray(&this->m_predictiveManifolds);
  btAlignedObjectArray<btActionInterface_*>::~btAlignedObjectArray(&this->m_actions);
  btAlignedObjectArray<btRigidBody_*>::~btAlignedObjectArray(&this->m_nonStaticRigidBodies);
  btAlignedObjectArray<btTypedConstraint_*>::~btAlignedObjectArray(&this->m_constraints);
  btAlignedObjectArray<btTypedConstraint_*>::~btAlignedObjectArray(&this->m_sortedConstraints);
  btCollisionWorld::~btCollisionWorld((btCollisionWorld *)this);
  return;
}

Assistant:

btDiscreteDynamicsWorld::~btDiscreteDynamicsWorld()
{
	//only delete it when we created it
	if (m_ownsIslandManager)
	{
		m_islandManager->~btSimulationIslandManager();
		btAlignedFree( m_islandManager);
	}
	if (m_solverIslandCallback)
	{
		m_solverIslandCallback->~InplaceSolverIslandCallback();
		btAlignedFree(m_solverIslandCallback);
	}
	if (m_ownsConstraintSolver)
	{

		m_constraintSolver->~btConstraintSolver();
		btAlignedFree(m_constraintSolver);
	}
}